

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::StateInteractionCase::generateVarLinkVertexShaderSrc
          (StateInteractionCase *this,string *outVtxSrc,GLSLVersion glslVersion,int numOutputs)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ostringstream vtxSrc;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  if (8 < (int)glslVersion) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n",0x2a);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"uniform highp vec4 u_color;\n",0x1c);
  uVar4 = (ulong)(numOutputs - 1U);
  switch(uVar4) {
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout(location = 3) out vec4 o_val5;\n",0x26);
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"flat out uvec4 val4;\n",0x15);
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"flat out ivec2 val3;\n",0x15);
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out vec3 val2[2];\n",0x12);
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"out vec4 val1;\n",0xf);
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out float val0;\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"   gl_Position = a_position;\n",0x1d);
    if (numOutputs - 1U < 5) {
      pcVar1 = &DAT_01b36870 + *(int *)(&DAT_01b36870 + uVar4 * 4);
      lVar3 = *(long *)(&DAT_01b36888 + uVar4 * 8);
    }
    else {
      lVar3 = 0x16;
      pcVar1 = "    val0 = u_color.x;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)outVtxSrc,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return;
  }
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, int numOutputs)
	{
		std::ostringstream vtxSrc;

		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";

		switch (numOutputs)
		{
		// Note all these cases fall through
		case 5:
			vtxSrc << "layout(location = 3) out vec4 o_val5;\n";
		case 4:
			vtxSrc << "flat out uvec4 val4;\n";
		case 3:
			vtxSrc << "flat out ivec2 val3;\n";
		case 2:
			vtxSrc << "out vec3 val2[2];\n";
		case 1:
			vtxSrc << "out vec4 val1;\n";
		default:
			vtxSrc << "out float val0;\n";
		}

		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";

		// The color uniform is passed in the last declared output variable
		switch (numOutputs)
		{
		case 5:
			vtxSrc << "    o_val5 = u_color;\n";
			break;
		case 4:
			vtxSrc << "    val4 = uvec4(u_color);\n";
			break;
		case 3:
			vtxSrc << "    val3 = ivec2(u_color);\n";
			break;
		case 2:
			vtxSrc << "    val2[0] = vec3(u_color);\n";
			break;
		case 1:
			vtxSrc << "    val1 = u_color;\n";
			break;
		default:
			vtxSrc << "    val0 = u_color.x;\n";
			break;
		}
		vtxSrc << "}\n";

		outVtxSrc = vtxSrc.str();
	}